

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O2

void __thiscall
NoMeEdgeCalculator::NoMeEdgeCalculator
          (NoMeEdgeCalculator *this,double nomeParam,
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *switchRateFS,
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *switchRateRS)

{
  (this->super_EdgeCalculator)._vptr_EdgeCalculator =
       (_func_int **)&PTR__NoMeEdgeCalculator_001d6ed8;
  (this->switchRateFS)._M_h._M_buckets = &(this->switchRateFS)._M_h._M_single_bucket;
  (this->switchRateFS)._M_h._M_bucket_count = 1;
  (this->switchRateFS)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->switchRateFS)._M_h._M_element_count = 0;
  (this->switchRateFS)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->switchRateFS)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->switchRateFS)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->switchRateRS)._M_h._M_buckets = &(this->switchRateRS)._M_h._M_single_bucket;
  (this->switchRateRS)._M_h._M_bucket_count = 1;
  (this->switchRateRS)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->switchRateRS)._M_h._M_element_count = 0;
  (this->switchRateRS)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->switchRateRS)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->switchRateRS)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->nomeParam = nomeParam;
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->switchRateFS)._M_h,&switchRateFS->_M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->switchRateRS)._M_h,&switchRateRS->_M_h);
  return;
}

Assistant:

NoMeEdgeCalculator::NoMeEdgeCalculator(double nomeParam, std::unordered_map<int, double> switchRateFS, std::unordered_map<int, double> switchRateRS) {
    this->nomeParam = nomeParam;
    this->switchRateFS = switchRateFS;
    this->switchRateRS = switchRateRS;
 }